

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addresses.cpp
# Opt level: O3

UniValue * __thiscall
wallet::DescribeWalletAddressVisitor::operator()
          (UniValue *__return_storage_ptr__,DescribeWalletAddressVisitor *this,PKHash *pkhash)

{
  SigningProvider *pSVar1;
  string key;
  string key_00;
  UniValue val;
  UniValue val_00;
  int iVar2;
  size_t sVar3;
  long in_FS_OFFSET;
  Span<const_unsigned_char> s;
  CPubKey vchPubKey;
  CKeyID keyID;
  undefined1 in_stack_fffffffffffffe48 [16];
  _Alloc_hider in_stack_fffffffffffffe58;
  size_type in_stack_fffffffffffffe60;
  undefined8 in_stack_fffffffffffffe68;
  undefined1 auVar4 [32];
  undefined1 in_stack_fffffffffffffe70 [56];
  undefined8 in_stack_fffffffffffffea8;
  undefined1 *puVar5;
  undefined8 in_stack_fffffffffffffeb0;
  pointer in_stack_fffffffffffffeb8;
  string local_138;
  UniValue local_118;
  long *local_c0 [2];
  long local_b0 [2];
  byte local_99 [65];
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48;
  undefined8 local_47;
  undefined4 local_3f;
  undefined2 local_3b;
  char local_39;
  CKeyID local_34;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  ToKeyID(&local_34,pkhash);
  local_58 = &local_48;
  __return_storage_ptr__->typ = VOBJ;
  (__return_storage_ptr__->val)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->val).field_2;
  (__return_storage_ptr__->val).field_2._M_local_buf[0] = '\0';
  *(undefined8 *)((long)&(__return_storage_ptr__->val).field_2 + 1) = local_47;
  *(undefined4 *)((long)&(__return_storage_ptr__->val).field_2 + 9) = local_3f;
  *(undefined2 *)((long)&(__return_storage_ptr__->val).field_2 + 0xd) = local_3b;
  (__return_storage_ptr__->val).field_2._M_local_buf[0xf] = local_39;
  (__return_storage_ptr__->val)._M_string_length = 0;
  local_50 = 0;
  local_48 = 0;
  (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_99[0] = 0xff;
  pSVar1 = this->provider;
  if (pSVar1 != (SigningProvider *)0x0) {
    iVar2 = (*pSVar1->_vptr_SigningProvider[4])(pSVar1,&local_34,local_99);
    if ((char)iVar2 != '\0') {
      local_c0[0] = local_b0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"pubkey","");
      sVar3 = 0x21;
      if ((local_99[0] & 0xfe) != 2) {
        if ((byte)(local_99[0] - 4) < 4) {
          sVar3 = *(size_t *)(&DAT_0049a7a8 + (ulong)(byte)(local_99[0] - 4) * 8);
        }
        else {
          sVar3 = 0;
        }
      }
      s.m_size = sVar3;
      s.m_data = local_99;
      HexStr_abi_cxx11_(&local_138,s);
      UniValue::
      UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (&local_118,&local_138);
      key.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffe58._M_p;
      key._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe48._0_8_;
      key._M_string_length = in_stack_fffffffffffffe48._8_8_;
      key.field_2._8_8_ = in_stack_fffffffffffffe60;
      auVar4 = in_stack_fffffffffffffe70._0_32_;
      val.val._M_dataplus._M_p = (pointer)auVar4._0_8_;
      val.val._M_string_length = auVar4._8_8_;
      val.val.field_2 =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            )auVar4._16_16_;
      val.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data =
           (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )in_stack_fffffffffffffe70._32_24_;
      val._0_8_ = in_stack_fffffffffffffe68;
      val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffea8;
      val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffeb0;
      val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffeb8;
      UniValue::pushKV(__return_storage_ptr__,key,val);
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_118.values);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_118.keys);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118.val._M_dataplus._M_p != &local_118.val.field_2) {
        operator_delete(local_118.val._M_dataplus._M_p,
                        local_118.val.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_138._M_dataplus._M_p._1_7_,local_138._M_dataplus._M_p._0_1_) !=
          &local_138.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_138._M_dataplus._M_p._1_7_,local_138._M_dataplus._M_p._0_1_),
                        local_138.field_2._M_allocated_capacity + 1);
      }
      if (local_c0[0] != local_b0) {
        operator_delete(local_c0[0],local_b0[0] + 1);
      }
      puVar5 = &stack0xfffffffffffffeb8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&stack0xfffffffffffffea8,"iscompressed","");
      local_138._M_dataplus._M_p._0_1_ = (local_99[0] & 0xfe) == 2;
      UniValue::UniValue<bool,_bool,_true>((UniValue *)&stack0xfffffffffffffe50,(bool *)&local_138);
      key_00.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffe58._M_p;
      key_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe48._0_8_;
      key_00._M_string_length = in_stack_fffffffffffffe48._8_8_;
      key_00.field_2._8_8_ = in_stack_fffffffffffffe60;
      auVar4 = in_stack_fffffffffffffe70._0_32_;
      val_00.val._M_dataplus._M_p = (pointer)auVar4._0_8_;
      val_00.val._M_string_length = auVar4._8_8_;
      val_00.val.field_2 =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            )auVar4._16_16_;
      val_00.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data =
           (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )in_stack_fffffffffffffe70._32_24_;
      val_00._0_8_ = in_stack_fffffffffffffe68;
      val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)puVar5;
      val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffeb0;
      val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffeb8;
      UniValue::pushKV(__return_storage_ptr__,key_00,val_00);
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector
                ((vector<UniValue,_std::allocator<UniValue>_> *)&stack0xfffffffffffffe90);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&stack0xfffffffffffffe78);
      if (in_stack_fffffffffffffe58._M_p != &stack0xfffffffffffffe68) {
        operator_delete(in_stack_fffffffffffffe58._M_p,in_stack_fffffffffffffe68 + 1);
      }
      if (puVar5 != &stack0xfffffffffffffeb8) {
        operator_delete(puVar5,(ulong)((long)&in_stack_fffffffffffffeb8->typ + 1));
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

UniValue operator()(const PKHash& pkhash) const
    {
        CKeyID keyID{ToKeyID(pkhash)};
        UniValue obj(UniValue::VOBJ);
        CPubKey vchPubKey;
        if (provider && provider->GetPubKey(keyID, vchPubKey)) {
            obj.pushKV("pubkey", HexStr(vchPubKey));
            obj.pushKV("iscompressed", vchPubKey.IsCompressed());
        }
        return obj;
    }